

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O2

void tcmalloc_backtrace_qsort
               (void *basearg,size_t count,size_t size,_func_int_void_ptr_void_ptr *compar)

{
  int iVar1;
  ulong count_00;
  char *b;
  ulong uVar2;
  ulong uVar3;
  
  while (1 < count) {
    swap((char *)basearg,(char *)((long)basearg + (count >> 1) * size),size);
    count_00 = 0;
    b = (char *)basearg;
    for (uVar2 = 1; b = b + size, count != uVar2; uVar2 = uVar2 + 1) {
      iVar1 = (*compar)(basearg,b);
      if ((0 < iVar1) && (uVar3 = count_00 + 1, count_00 = uVar2, uVar2 != uVar3)) {
        swap((char *)((long)basearg + uVar3 * size),b,size);
        count_00 = uVar3;
      }
    }
    if (count_00 != 0) {
      swap((char *)basearg,(char *)((long)basearg + count_00 * size),size);
    }
    if (count_00 * 2 < count) {
      tcmalloc_backtrace_qsort(basearg,count_00,size,compar);
      count = count - (count_00 + 1);
      basearg = (void *)((long)basearg + (count_00 + 1) * size);
    }
    else {
      tcmalloc_backtrace_qsort
                ((char *)((long)basearg + (count_00 + 1) * size),count - (count_00 + 1),size,compar)
      ;
      count = count_00;
    }
  }
  return;
}

Assistant:

void
backtrace_qsort (void *basearg, size_t count, size_t size,
		 int (*compar) (const void *, const void *))
{
  char *base = (char *) basearg;
  size_t i;
  size_t mid;

 tail_recurse:
  if (count < 2)
    return;

  /* The symbol table and DWARF tables, which is all we use this
     routine for, tend to be roughly sorted.  Pick the middle element
     in the array as our pivot point, so that we are more likely to
     cut the array in half for each recursion step.  */
  swap (base, base + (count / 2) * size, size);

  mid = 0;
  for (i = 1; i < count; i++)
    {
      if ((*compar) (base, base + i * size) > 0)
	{
	  ++mid;
	  if (i != mid)
	    swap (base + mid * size, base + i * size, size);
	}
    }

  if (mid > 0)
    swap (base, base + mid * size, size);

  /* Recurse with the smaller array, loop with the larger one.  That
     ensures that our maximum stack depth is log count.  */
  if (2 * mid < count)
    {
      backtrace_qsort (base, mid, size, compar);
      base += (mid + 1) * size;
      count -= mid + 1;
      goto tail_recurse;
    }
  else
    {
      backtrace_qsort (base + (mid + 1) * size, count - (mid + 1),
		       size, compar);
      count = mid;
      goto tail_recurse;
    }
}